

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void anon_unknown.dwarf_889438::TranslateMemoryDecoration
               (TQualifier *qualifier,
               vector<spv::Decoration,_std::allocator<spv::Decoration>_> *memory,
               bool useVulkanMemoryModel)

{
  bool bVar1;
  value_type local_34 [6];
  undefined1 local_19;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> *pvStack_18;
  bool useVulkanMemoryModel_local;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> *memory_local;
  TQualifier *qualifier_local;
  
  local_19 = useVulkanMemoryModel;
  pvStack_18 = memory;
  memory_local = (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)qualifier;
  if (!useVulkanMemoryModel) {
    bVar1 = glslang::TQualifier::isVolatile(qualifier);
    if (bVar1) {
      local_34[5] = 0x15;
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::push_back
                (pvStack_18,local_34 + 5);
      local_34[4] = 0x17;
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::push_back
                (pvStack_18,local_34 + 4);
    }
    else {
      bVar1 = glslang::TQualifier::isCoherent((TQualifier *)memory_local);
      if (bVar1) {
        local_34[3] = 0x17;
        std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::push_back
                  (pvStack_18,local_34 + 3);
      }
    }
  }
  bVar1 = glslang::TQualifier::isRestrict((TQualifier *)memory_local);
  if (bVar1) {
    local_34[2] = 0x13;
    std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::push_back
              (pvStack_18,local_34 + 2);
  }
  bVar1 = glslang::TQualifier::isReadOnly((TQualifier *)memory_local);
  if (bVar1) {
    local_34[1] = 0x18;
    std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::push_back
              (pvStack_18,local_34 + 1);
  }
  bVar1 = glslang::TQualifier::isWriteOnly((TQualifier *)memory_local);
  if (bVar1) {
    local_34[0] = DecorationNonReadable;
    std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::push_back(pvStack_18,local_34);
  }
  return;
}

Assistant:

void TranslateMemoryDecoration(const glslang::TQualifier& qualifier, std::vector<spv::Decoration>& memory,
    bool useVulkanMemoryModel)
{
    if (!useVulkanMemoryModel) {
        if (qualifier.isVolatile()) {
            memory.push_back(spv::DecorationVolatile);
            memory.push_back(spv::DecorationCoherent);
        } else if (qualifier.isCoherent()) {
            memory.push_back(spv::DecorationCoherent);
        }
    }
    if (qualifier.isRestrict())
        memory.push_back(spv::DecorationRestrict);
    if (qualifier.isReadOnly())
        memory.push_back(spv::DecorationNonWritable);
    if (qualifier.isWriteOnly())
       memory.push_back(spv::DecorationNonReadable);
}